

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O1

void surv0_pipe_close(void *arg)

{
  nni_mtx *mtx;
  long lVar1;
  int iVar2;
  nni_list *list;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x68));
  nni_aio_close((nni_aio *)((long)arg + 0x230));
  mtx = (nni_mtx *)(lVar1 + 0x20);
  nni_mtx_lock(mtx);
  *(undefined1 *)((long)arg + 0x3f9) = 1;
  nni_lmq_flush((nni_lmq *)((long)arg + 0x10));
  list = (nni_list *)(lVar1 + 8);
  iVar2 = nni_list_active(list,arg);
  if (iVar2 != 0) {
    nni_list_remove(list,arg);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
surv0_pipe_close(void *arg)
{
	surv0_pipe *p = arg;
	surv0_sock *s = p->sock;

	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);

	nni_mtx_lock(&s->mtx);
	p->closed = true;
	nni_lmq_flush(&p->send_queue);
	if (nni_list_active(&s->pipes, p)) {
		nni_list_remove(&s->pipes, p);
	}
	nni_mtx_unlock(&s->mtx);
}